

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

bool Am_Valid_and_Visible_List_Or_Object(Am_Value *value,bool want_visible)

{
  bool bVar1;
  Am_ID_Tag AVar2;
  Am_Value *in_value;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object o;
  Am_Value_List l;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object obj;
  bool want_visible_local;
  Am_Value *value_local;
  
  obj.data._7_1_ = want_visible;
  bVar1 = Am_Value::Valid(value);
  if (bVar1) {
    if (value->type == 0xa001) {
      Am_Object::Am_Object(&local_28);
      Am_Object::operator=(&local_28,value);
      if ((obj.data._7_1_ & 1) == 0) {
        Am_Object::Am_Object((Am_Object *)&l.item,&local_28);
        value_local._7_1_ = Am_Object_Valid_And_Not_Part((Am_Object *)&l.item);
        Am_Object::~Am_Object((Am_Object *)&l.item);
      }
      else {
        Am_Object::Am_Object(local_40,&local_28);
        value_local._7_1_ = Am_Object_And_Owners_Valid_And_Visible(local_40);
        Am_Object::~Am_Object(local_40);
      }
      Am_Object::~Am_Object(&local_28);
    }
    else {
      AVar2 = Am_Type_Class(value->type);
      if ((AVar2 == 0x2000) && (bVar1 = Am_Value_List::Test((value->value).wrapper_value), bVar1)) {
        Am_Value_List::Am_Value_List((Am_Value_List *)&o);
        Am_Value_List::operator=((Am_Value_List *)&o,value);
        Am_Object::Am_Object(&local_68);
        Am_Value_List::Start((Am_Value_List *)&o);
        while (bVar1 = Am_Value_List::Last((Am_Value_List *)&o), ((bVar1 ^ 0xffU) & 1) != 0) {
          in_value = Am_Value_List::Get((Am_Value_List *)&o);
          Am_Object::operator=(&local_68,in_value);
          if ((obj.data._7_1_ & 1) == 0) {
            Am_Object::Am_Object(&local_78,&local_68);
            bVar1 = Am_Object_Valid_And_Not_Part(&local_78);
            Am_Object::~Am_Object(&local_78);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              value_local._7_1_ = false;
              goto LAB_00223e44;
            }
          }
          else {
            Am_Object::Am_Object(&local_70,&local_68);
            bVar1 = Am_Object_And_Owners_Valid_And_Visible(&local_70);
            Am_Object::~Am_Object(&local_70);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              value_local._7_1_ = false;
              goto LAB_00223e44;
            }
          }
          Am_Value_List::Next((Am_Value_List *)&o);
        }
        value_local._7_1_ = true;
LAB_00223e44:
        Am_Object::~Am_Object(&local_68);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&o);
      }
      else {
        value_local._7_1_ = true;
      }
    }
  }
  else {
    value_local._7_1_ = true;
  }
  return value_local._7_1_;
}

Assistant:

bool
Am_Valid_and_Visible_List_Or_Object(Am_Value value, bool want_visible)
{
  if (!value.Valid())
    return true; //if no value, then OK
  if (value.type == Am_OBJECT) {
    Am_Object obj;
    obj = value;
    if (want_visible)
      return Am_Object_And_Owners_Valid_And_Visible(obj);
    else
      return Am_Object_Valid_And_Not_Part(obj);
  }
  //// BUG: Need to move add_ref to setter to avoid this annoyance
  else if (Am_Type_Class(value.type) == Am_WRAPPER &&
           Am_Value_List::Test(value.value.wrapper_value)) {
    // test each value and return true if all ok
    Am_Value_List l;
    l = value;
    Am_Object o;
    for (l.Start(); !l.Last(); l.Next()) {
      o = l.Get();
      if (want_visible) {
        if (!Am_Object_And_Owners_Valid_And_Visible(o))
          return false;
      } else //want it to be valid but invisible
          if (!Am_Object_Valid_And_Not_Part(o))
        return false;
    }
    return true; //all are ok
  } else
    return true; //slot does not contain an object
}